

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  int *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  anon_struct_8_44_94931171_for_Info aVar4;
  long lVar5;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar6) [5];
  uint uVar7;
  long lVar8;
  
  uVar2 = pTexInfo->BitsPerPixel;
  uVar7 = uVar2 << 0x1d | uVar2 - 8 >> 3;
  if (uVar7 < 8) {
    lVar8 = *(long *)(&DAT_001bc148 + (ulong)uVar7 * 8);
  }
  else {
    lVar8 = 0;
  }
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
    lVar5 = (ulong)((SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
                   (MipLevel - (pTexInfo->Alignment).MipTailStartLod)) * 0x3c;
    paGVar6 = Gen9MipTailSlotOffset1DSurface;
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    aVar4 = (pTexInfo->Flags).Info;
    if (((ulong)aVar4 >> 0x26 & 1) == 0) {
      uVar7 = aVar4._4_4_ >> 3 & 4;
    }
    else {
      uVar3 = (pTexInfo->MSAA).NumSamples;
      if (uVar3 == 4) {
        uVar7 = 2;
      }
      else if (uVar3 == 8) {
        uVar7 = 3;
      }
      else {
        uVar7 = 4;
        if (uVar3 != 0x10) {
          uVar7 = (uint)(uVar3 == 2);
        }
      }
    }
    lVar5 = (ulong)((MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar7) * 0x3c;
    paGVar6 = Gen9MipTailSlotOffset2DSurface;
    break;
  case RESOURCE_3D:
    lVar5 = (ulong)((SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
                   (MipLevel - (pTexInfo->Alignment).MipTailStartLod)) * 0x3c;
    paGVar6 = Gen9MipTailSlotOffset3DSurface;
    break;
  default:
    goto switchD_001a6d7f_default;
  }
  piVar1 = (int *)((long)&(*paGVar6)[lVar8].X + lVar5);
  *OffsetX = uVar2 * *piVar1 >> 3;
  *OffsetY = piVar1[1];
  *OffsetZ = piVar1[2];
switchD_001a6d7f_default:
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                          uint32_t          MipLevel,
                                                          uint32_t *        OffsetX,
                                                          uint32_t *        OffsetY,
                                                          uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on

        *OffsetX = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_3D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}